

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.cpp
# Opt level: O1

void duckdb_nanoarrow::ArrowSchemaRelease(ArrowSchema *schema)

{
  ArrowSchema *pAVar1;
  long lVar2;
  
  if (schema->format != (char *)0x0) {
    free(schema->format);
  }
  if (schema->name != (char *)0x0) {
    free(schema->name);
  }
  if (schema->metadata != (char *)0x0) {
    free(schema->metadata);
  }
  if (schema->children != (ArrowSchema **)0x0) {
    if (0 < schema->n_children) {
      lVar2 = 0;
      do {
        pAVar1 = schema->children[lVar2];
        if (pAVar1 != (ArrowSchema *)0x0) {
          if (pAVar1->release != (_func_void_ArrowSchema_ptr *)0x0) {
            (*pAVar1->release)(pAVar1);
          }
          free(schema->children[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < schema->n_children);
    }
    free(schema->children);
  }
  pAVar1 = schema->dictionary;
  if (pAVar1 != (ArrowSchema *)0x0) {
    if (pAVar1->release != (_func_void_ArrowSchema_ptr *)0x0) {
      (*pAVar1->release)(pAVar1);
    }
    free(schema->dictionary);
  }
  if (schema->private_data != (void *)0x0) {
    free(schema->private_data);
  }
  schema->release = (_func_void_ArrowSchema_ptr *)0x0;
  return;
}

Assistant:

void ArrowSchemaRelease(struct ArrowSchema *schema) {
	if (schema->format != NULL)
		ArrowFree((void *)schema->format);
	if (schema->name != NULL)
		ArrowFree((void *)schema->name);
	if (schema->metadata != NULL)
		ArrowFree((void *)schema->metadata);

	// This object owns the memory for all the children, but those
	// children may have been generated elsewhere and might have
	// their own release() callback.
	if (schema->children != NULL) {
		for (int64_t i = 0; i < schema->n_children; i++) {
			if (schema->children[i] != NULL) {
				if (schema->children[i]->release != NULL) {
					schema->children[i]->release(schema->children[i]);
				}

				ArrowFree(schema->children[i]);
			}
		}

		ArrowFree(schema->children);
	}

	// This object owns the memory for the dictionary but it
	// may have been generated somewhere else and have its own
	// release() callback.
	if (schema->dictionary != NULL) {
		if (schema->dictionary->release != NULL) {
			schema->dictionary->release(schema->dictionary);
		}

		ArrowFree(schema->dictionary);
	}

	// private data not currently used
	if (schema->private_data != NULL) {
		ArrowFree(schema->private_data);
	}

	schema->release = NULL;
}